

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall wabt::Module::AppendFields(Module *this,ModuleFieldList *fields)

{
  bool bVar1;
  unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> local_20;
  intrusive_list<wabt::ModuleField> *local_18;
  ModuleFieldList *fields_local;
  Module *this_local;
  
  local_18 = fields;
  fields_local = (ModuleFieldList *)this;
  while( true ) {
    bVar1 = intrusive_list<wabt::ModuleField>::empty(local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    intrusive_list<wabt::ModuleField>::extract_front((intrusive_list<wabt::ModuleField> *)&local_20)
    ;
    AppendField(this,&local_20);
    std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::~unique_ptr
              (&local_20);
  }
  return;
}

Assistant:

void Module::AppendFields(ModuleFieldList* fields) {
  while (!fields->empty())
    AppendField(std::unique_ptr<ModuleField>(fields->extract_front()));
}